

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinear.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorLinear::Update(ChLinkMotorLinear *this,double mytime,bool update_assets)

{
  ChFrameMoving<double> aframe12;
  ChFrameMoving<double> aframe2;
  ChFrameMoving<double> aframe1;
  ChVector<double> local_408;
  ChFrameMoving<double> local_3e8;
  ChFrameMoving<double> local_2f0;
  ChFrameMoving<double> local_1f8;
  ChFrameMoving<double> local_100;
  
  ChLinkMotor::Update(&this->super_ChLinkMotor,mytime,update_assets);
  ChFrameMoving<double>::ChFrameMoving
            (&local_2f0,&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1);
  ChFrameMoving<double>::ChFrameMoving
            (&local_3e8,
             &((this->super_ChLinkMotor).super_ChLinkMateGeneric.super_ChLinkMate.super_ChLink.Body1
              )->super_ChFrameMoving<double>);
  ChFrameMoving<double>::operator>>(&local_100,&local_2f0,&local_3e8);
  ChFrameMoving<double>::ChFrameMoving
            (&local_3e8,&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2);
  ChFrameMoving<double>::ChFrameMoving
            (&local_1f8,
             &((this->super_ChLinkMotor).super_ChLinkMateGeneric.super_ChLinkMate.super_ChLink.Body2
              )->super_ChFrameMoving<double>);
  ChFrameMoving<double>::operator>>(&local_2f0,&local_3e8,&local_1f8);
  local_408.m_data[2] = 0.0;
  local_1f8.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&DAT_3ff0000000000000;
  local_1f8.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  local_408.m_data[0] = 0.0;
  local_408.m_data[1] = 0.0;
  local_1f8.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_1f8.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&local_3e8,&local_408,(ChQuaternion<double> *)&local_1f8);
  ChFrameMoving<double>::TransformParentToLocal(&local_2f0,&local_100,&local_3e8);
  this->mpos = local_3e8.super_ChFrame<double>.coord.pos.m_data[0];
  this->mpos_dt = local_3e8.coord_dt.pos.m_data[0];
  this->mpos_dtdt = local_3e8.coord_dtdt.pos.m_data[0];
  return;
}

Assistant:

void ChLinkMotorLinear::Update(double mytime, bool update_assets) {
    // Inherit parent class:
    ChLinkMotor::Update(mytime, update_assets);

    // compute aux data for future reference (istantaneous pos speed accel)
    ChFrameMoving<> aframe1 = ChFrameMoving<>(this->frame1) >> (ChFrameMoving<>)(*this->Body1);
    ChFrameMoving<> aframe2 = ChFrameMoving<>(this->frame2) >> (ChFrameMoving<>)(*this->Body2);
    ChFrameMoving<> aframe12;
    aframe2.TransformParentToLocal(aframe1, aframe12);

    //// RADU TODO: revisit this.
    //// This is incorrect for GuideConstraint::FREE
    //// Should use something like sqrt(Vdot(relpos,relpos)), but taking into account sign?

    this->mpos = aframe12.GetPos().x();
    this->mpos_dt = aframe12.GetPos_dt().x();
    this->mpos_dtdt = aframe12.GetPos_dtdt().x();
}